

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O1

Regexp * __thiscall
duckdb_re2::CoalesceWalker::PostVisit
          (CoalesceWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  ushort uVar1;
  Regexp *this_00;
  bool bVar2;
  Regexp *pRVar3;
  Regexp **ppRVar4;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  if (re->nsub_ != 0) {
    if (re->op_ == '\x05') {
      uVar6 = (ulong)re->nsub_;
      if (re->nsub_ != 0) {
        uVar9 = 1;
        do {
          if ((uVar9 < uVar6) &&
             (bVar2 = CanCoalesce(child_args[uVar9 - 1],child_args[uVar9]), bVar2)) {
            uVar6 = (ulong)re->nsub_;
            if (re->nsub_ != 0) {
              ppRVar4 = child_args + 1;
              uVar9 = 0;
              do {
                uVar9 = uVar9 + 1;
                if ((uVar9 < uVar6) && (bVar2 = CanCoalesce(ppRVar4[-1],*ppRVar4), bVar2)) {
                  DoCoalesce(ppRVar4 + -1,ppRVar4);
                }
                uVar6 = (ulong)re->nsub_;
                ppRVar4 = ppRVar4 + 1;
              } while (uVar9 < uVar6);
            }
            if ((int)uVar6 == 0) {
              iVar7 = 0;
            }
            else {
              uVar9 = 0;
              iVar7 = 0;
              do {
                iVar7 = iVar7 + (uint)(child_args[uVar9]->op_ == '\x02');
                uVar9 = uVar9 + 1;
              } while (uVar6 != uVar9);
            }
            pRVar3 = (Regexp *)operator_new(0x28);
            Regexp::Regexp(pRVar3,(uint)re->op_,(uint)re->parse_flags_);
            uVar8 = (uint)re->nsub_ - iVar7;
            if (1 < (int)uVar8) {
              ppRVar4 = (Regexp **)operator_new__((ulong)uVar8 << 3);
              (pRVar3->field_5).submany_ = ppRVar4;
            }
            pRVar3->nsub_ = (ushort)uVar8;
            if ((ushort)uVar8 < 2) {
              paVar5 = &pRVar3->field_5;
            }
            else {
              paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
            }
            if (re->nsub_ == 0) {
              return pRVar3;
            }
            uVar6 = 0;
            iVar7 = 0;
            do {
              this_00 = child_args[uVar6];
              if (this_00->op_ == '\x02') {
                Regexp::Decref(this_00);
              }
              else {
                paVar5[iVar7].subone_ = this_00;
                iVar7 = iVar7 + 1;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < re->nsub_);
            return pRVar3;
          }
          uVar6 = (ulong)re->nsub_;
          bVar2 = uVar9 < uVar6;
          uVar9 = uVar9 + 1;
        } while (bVar2);
      }
      bVar2 = ChildArgsChanged(re,child_args);
      if (bVar2) {
        pRVar3 = (Regexp *)operator_new(0x28);
        Regexp::Regexp(pRVar3,(uint)re->op_,(uint)re->parse_flags_);
        uVar1 = re->nsub_;
        if (1 < (ulong)uVar1) {
          ppRVar4 = (Regexp **)operator_new__((ulong)((uint)uVar1 * 8));
          (pRVar3->field_5).submany_ = ppRVar4;
        }
        pRVar3->nsub_ = uVar1;
        if (uVar1 < 2) {
          paVar5 = &pRVar3->field_5;
        }
        else {
          paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
        }
        if (uVar1 != 0) {
          uVar6 = 0;
          do {
            paVar5[uVar6] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar6);
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        return pRVar3;
      }
    }
    else {
      bVar2 = ChildArgsChanged(re,child_args);
      if (bVar2) {
        pRVar3 = (Regexp *)operator_new(0x28);
        Regexp::Regexp(pRVar3,(uint)re->op_,(uint)re->parse_flags_);
        uVar1 = re->nsub_;
        if (1 < (ulong)uVar1) {
          ppRVar4 = (Regexp **)operator_new__((ulong)((uint)uVar1 * 8));
          (pRVar3->field_5).submany_ = ppRVar4;
        }
        pRVar3->nsub_ = uVar1;
        if (uVar1 < 2) {
          paVar5 = &pRVar3->field_5;
        }
        else {
          paVar5 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(pRVar3->field_5).submany_;
        }
        if (uVar1 != 0) {
          uVar6 = 0;
          do {
            paVar5[uVar6] = *(anon_union_8_2_3df47e5c_for_Regexp_7 *)(child_args + uVar6);
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        if (re->op_ != '\n') {
          if (re->op_ != '\v') {
            return pRVar3;
          }
          (pRVar3->arguments).repeat.max_ = (re->arguments).repeat.max_;
          return pRVar3;
        }
        (pRVar3->arguments).repeat = (re->arguments).repeat;
        return pRVar3;
      }
    }
  }
  pRVar3 = Regexp::Incref(re);
  return pRVar3;
}

Assistant:

Regexp* CoalesceWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  if (re->nsub() == 0)
    return re->Incref();

  if (re->op() != kRegexpConcat) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    // Repeats and Captures have additional data that must be copied.
    if (re->op() == kRegexpRepeat) {
      nre->arguments.repeat.min_ = re->min();
      nre->arguments.repeat.max_ = re->max();
    } else if (re->op() == kRegexpCapture) {
      nre->arguments.capture.cap_ = re->cap();
    }
    return nre;
  }

  bool can_coalesce = false;
  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1])) {
      can_coalesce = true;
      break;
    }
  }
  if (!can_coalesce) {
    if (!ChildArgsChanged(re, child_args))
      return re->Incref();

    // Something changed. Build a new op.
    Regexp* nre = new Regexp(re->op(), re->parse_flags());
    nre->AllocSub(re->nsub());
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < re->nsub(); i++)
      nre_subs[i] = child_args[i];
    return nre;
  }

  for (int i = 0; i < re->nsub(); i++) {
    if (i+1 < re->nsub() &&
        CanCoalesce(child_args[i], child_args[i+1]))
      DoCoalesce(&child_args[i], &child_args[i+1]);
  }
  // Determine how many empty matches were left by DoCoalesce.
  int n = 0;
  for (int i = n; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch)
      n++;
  }
  // Build a new op.
  Regexp* nre = new Regexp(re->op(), re->parse_flags());
  nre->AllocSub(re->nsub() - n);
  Regexp** nre_subs = nre->sub();
  for (int i = 0, j = 0; i < re->nsub(); i++) {
    if (child_args[i]->op() == kRegexpEmptyMatch) {
      child_args[i]->Decref();
      continue;
    }
    nre_subs[j] = child_args[i];
    j++;
  }
  return nre;
}